

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void INT_CMadd_poll(CManager_conflict cm,CMPollFunc func,void *client_data)

{
  int iVar1;
  CMControlList p_Var2;
  CMPollFunc *pp_Var3;
  func_entry *ptr;
  func_entry *pfVar4;
  int iVar5;
  ulong uVar6;
  
  p_Var2 = cm->control_list;
  ptr = p_Var2->polling_function_list;
  if (ptr == (func_entry *)0x0) {
    ptr = (func_entry *)INT_CMmalloc(0x140);
    p_Var2->pflist_size = 10;
    uVar6 = 0;
  }
  else {
    uVar6 = 0xffffffffffffffff;
    pfVar4 = ptr;
    do {
      iVar5 = (int)uVar6;
      uVar6 = (ulong)(iVar5 + 1);
      pp_Var3 = &pfVar4->func;
      pfVar4 = pfVar4 + 1;
    } while (*pp_Var3 != (CMPollFunc)0x0);
    iVar1 = p_Var2->pflist_size;
    if (iVar1 < iVar5 + -1) {
      p_Var2->pflist_size = iVar1 * 2;
      ptr = (func_entry *)INT_CMrealloc(ptr,(long)iVar1 << 6);
    }
  }
  ptr[uVar6].cm = cm;
  ptr[uVar6].func = func;
  ptr[uVar6].client_data = client_data;
  ptr[uVar6 + 1].func = (CMPollFunc)0x0;
  p_Var2->polling_function_list = ptr;
  return;
}

Assistant:

extern
void
INT_CMadd_poll(CManager cm, CMPollFunc func, void *client_data)
{
    CMControlList_add_poll(cm->control_list, cm, func, client_data);
}